

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xar_bid(archive_read *a,int best_bid)

{
  uint uVar1;
  uchar *p;
  uint *puVar2;
  int iVar3;
  
  puVar2 = (uint *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
  if (puVar2 == (uint *)0x0) {
    iVar3 = -1;
  }
  else {
    uVar1 = *puVar2;
    iVar3 = 0;
    if ((((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ==
          0x78617221) &&
        (iVar3 = 0, (ushort)((ushort)puVar2[1] << 8 | (ushort)puVar2[1] >> 8) == 0x1c)) &&
       ((ushort)(*(ushort *)((long)puVar2 + 6) << 8 | *(ushort *)((long)puVar2 + 6) >> 8) == 1)) {
      uVar1 = puVar2[6];
      iVar3 = 0x60;
      if (2 < (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
xar_bid(struct archive_read *a, int best_bid)
{
	const unsigned char *b;
	int bid;

	(void)best_bid; /* UNUSED */

	b = __archive_read_ahead(a, HEADER_SIZE, NULL);
	if (b == NULL)
		return (-1);

	bid = 0;
	/*
	 * Verify magic code
	 */
	if (archive_be32dec(b) != HEADER_MAGIC)
		return (0);
	bid += 32;
	/*
	 * Verify header size
	 */
	if (archive_be16dec(b+4) != HEADER_SIZE)
		return (0);
	bid += 16;
	/*
	 * Verify header version
	 */
	if (archive_be16dec(b+6) != HEADER_VERSION)
		return (0);
	bid += 16;
	/*
	 * Verify type of checksum
	 */
	switch (archive_be32dec(b+24)) {
	case CKSUM_NONE:
	case CKSUM_SHA1:
	case CKSUM_MD5:
		bid += 32;
		break;
	default:
		return (0);
	}

	return (bid);
}